

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkSaveCopy(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **__s;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = pNtk->vObjs->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar5 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  memset(__s,0,(long)iVar1 * 8);
  pVVar2 = pNtk->vObjs;
  lVar6 = (long)pVVar2->nSize;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (iVar1 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[lVar7] = *(void **)((long)pvVar3 + 0x40);
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Abc_NtkSaveCopy( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vCopies;
    Abc_Obj_t * pObj;
    int i;
    vCopies = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( vCopies, i, pObj->pCopy );
    return vCopies;
}